

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layoutengine.cpp
# Opt level: O2

QSize QtMWidgets::qSmartMinSize(QWidget *w)

{
  QSize QVar1;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_4c;
  QSize local_48;
  QSize local_40;
  QSize local_38;
  QSize local_30;
  
  local_30 = (QSize)(**(code **)(*(long *)w + 0x70))();
  local_38 = (QSize)(**(code **)(*(long *)w + 0x78))(w);
  local_40 = (QSize)QWidget::minimumSize();
  local_48 = (QSize)QWidget::maximumSize();
  local_4c.data = QWidget::sizePolicy();
  QVar1 = qSmartMinSize(&local_30,&local_38,&local_40,&local_48,(QSizePolicy *)&local_4c.bits);
  return QVar1;
}

Assistant:

QSize qSmartMinSize( const QWidget * w )
{
	return qSmartMinSize( w->sizeHint(), w->minimumSizeHint(),
		w->minimumSize(), w->maximumSize(),
		w->sizePolicy() );
}